

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O3

int32_t ustrcase_internalToUpper_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *param_3,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  char cVar1;
  UChar UVar2;
  ushort uVar3;
  uint uVar4;
  int32_t result;
  uint uVar5;
  undefined1 *puVar6;
  UTrie2 *pUVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  UChar *local_58;
  UChar *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (caseLocale != 4) {
    local_48 = 0;
    local_38 = 0;
    uStack_40 = (ulong)(uint)srcLength;
    if (caseLocale == 2) {
      puVar6 = icu_63::LatinCase::TO_UPPER_TR;
    }
    else {
      puVar6 = icu_63::LatinCase::TO_UPPER_NORMAL;
    }
    uVar4 = 0;
    local_50 = src;
    pUVar7 = ucase_getTrie_63();
    uVar5 = 0;
    uVar9 = 0;
    do {
      do {
        if ((int)uVar4 < srcLength) {
          do {
            UVar2 = src[(int)uVar4];
            uVar12 = (uint)(ushort)UVar2;
            uVar11 = (uint)(ushort)UVar2;
            uVar10 = uVar4;
            if ((ushort)UVar2 < 0x17f) {
              cVar1 = puVar6[(ushort)UVar2];
              uVar8 = (uint)cVar1;
              if (cVar1 == -0x80) goto LAB_001b31a4;
              if (cVar1 != '\0') {
LAB_001b309e:
                uVar11 = ~uVar9 + uVar4 + 1;
                uVar10 = uVar5;
                if (0 < (int)uVar11) {
                  if (edits != (Edits *)0x0) {
                    icu_63::Edits::addUnchanged(edits,uVar11);
                  }
                  if ((options >> 0xe & 1) == 0) {
                    if ((uVar5 ^ 0x7fffffff) < uVar11) goto LAB_001b32f2;
                    uVar10 = uVar11 + uVar5;
                    if ((int)uVar10 <= destCapacity) {
                      u_memcpy_63(dest + (int)uVar5,src + (int)uVar9,uVar11);
                    }
                  }
                }
                if ((int)uVar10 < 0) goto LAB_001b32f2;
                uVar12 = uVar8 + (ushort)UVar2;
                if ((int)uVar10 < destCapacity) {
                  dest[uVar10] = (UChar)uVar12;
LAB_001b314c:
                  uVar5 = uVar10 + 1;
                }
                else {
                  uVar5 = 0xffffffff;
                  if (uVar10 != 0x7fffffff) goto LAB_001b314c;
                }
                if (edits != (Edits *)0x0) {
                  icu_63::Edits::addReplace(edits,1,1);
                }
                uVar9 = uVar4 + 1;
                if ((int)uVar5 < 0) goto LAB_001b32f2;
              }
            }
            else {
              if ((0xd7ff < (ushort)UVar2) ||
                 (uVar3 = pUVar7->index
                          [((ushort)UVar2 & 0x1f) + (uint)pUVar7->index[(ushort)UVar2 >> 5] * 4],
                 (uVar3 & 8) != 0)) goto LAB_001b31a4;
              if (0x7f < uVar3 && (uVar3 & 3) == 1) {
                uVar8 = (uint)(int)(short)uVar3 >> 7;
                goto LAB_001b309e;
              }
            }
            uVar4 = uVar4 + 1;
          } while ((int)uVar4 < srcLength);
          uVar11 = uVar12 & 0xffff;
          uVar10 = uVar4;
        }
        else {
          uVar11 = 0;
          uVar10 = uVar4;
        }
LAB_001b31a4:
        if (srcLength <= (int)uVar10) {
          uVar11 = uVar10 - uVar9;
          uVar4 = uVar5;
          if (uVar11 == 0 || (int)uVar10 < (int)uVar9) {
LAB_001b33b5:
            if (-1 < (int)uVar4) goto LAB_001b3308;
          }
          else {
            if (edits != (Edits *)0x0) {
              icu_63::Edits::addUnchanged(edits,uVar11);
            }
            if ((options >> 0xe & 1) != 0) goto LAB_001b33b5;
            if (uVar11 <= (uVar5 ^ 0x7fffffff)) {
              uVar4 = uVar5 + uVar11;
              if ((int)uVar4 <= destCapacity) {
                u_memcpy_63(dest + (int)uVar5,src + (int)uVar9,uVar11);
              }
              goto LAB_001b33b5;
            }
          }
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          uVar4 = 0;
          goto LAB_001b3308;
        }
        uVar4 = uVar10 + 1;
        uStack_40 = CONCAT44(uVar10,(undefined4)uStack_40);
        if ((((uVar11 & 0xfc00) == 0xd800) && ((int)uVar4 < srcLength)) &&
           (((ushort)src[(int)uVar4] & 0xfc00) == 0xdc00)) {
          uVar11 = uVar11 * 0x400 + (uint)(ushort)src[(int)uVar4] + 0xfca02400;
          uVar4 = uVar10 + 2;
        }
        local_38 = CONCAT44(local_38._4_4_,uVar4);
        result = ucase_toFullUpper_63
                           (uVar11,icu_63::anon_unknown_10::utf16_caseContextIterator,&local_50,
                            &local_58,caseLocale);
      } while (result < 0);
      uVar12 = uVar10 - uVar9;
      uVar11 = uVar5;
      if (uVar12 != 0 && (int)uVar9 <= (int)uVar10) {
        if (edits != (Edits *)0x0) {
          icu_63::Edits::addUnchanged(edits,uVar12);
        }
        if ((options >> 0xe & 1) == 0) {
          if ((uVar5 ^ 0x7fffffff) < uVar12) goto LAB_001b32f2;
          uVar11 = uVar12 + uVar5;
          if ((int)uVar11 <= destCapacity) {
            u_memcpy_63(dest + (int)uVar5,src + (int)uVar9,uVar12);
          }
        }
      }
      if (((int)uVar11 < 0) ||
         (uVar5 = icu_63::anon_unknown_10::appendResult
                            (dest,uVar11,destCapacity,result,local_58,uVar4 - uVar10,options,edits),
         uVar9 = uVar4, (int)uVar5 < 0)) goto LAB_001b32f2;
    } while( true );
  }
  uVar4 = icu_63::GreekUpper::toUpper(options,dest,destCapacity,src,srcLength,edits,errorCode);
LAB_001b3308:
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (destCapacity < (int)uVar4) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else if (edits != (Edits *)0x0) {
      icu_63::Edits::copyErrorTo(edits,errorCode);
    }
  }
  return uVar4;
LAB_001b32f2:
  *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  uVar4 = 0;
  goto LAB_001b3308;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalToUpper(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_UNUSED
                         UChar *dest, int32_t destCapacity,
                         const UChar *src, int32_t srcLength,
                         icu::Edits *edits,
                         UErrorCode &errorCode) {
    int32_t destIndex;
    if (caseLocale == UCASE_LOC_GREEK) {
        destIndex = GreekUpper::toUpper(options, dest, destCapacity,
                                        src, srcLength, edits, errorCode);
    } else {
        UCaseContext csc=UCASECONTEXT_INITIALIZER;
        csc.p=(void *)src;
        csc.limit=srcLength;
        destIndex = toUpper(
            caseLocale, options,
            dest, destCapacity,
            src, &csc, srcLength,
            edits, errorCode);
    }
    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}